

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O2

void slang::ast::ClassPropertySymbol::fromSyntax
               (Scope *scope,ClassPropertyDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::ClassPropertySymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  bitmask<slang::ast::DeclaredTypeFlags> *pbVar2;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar3;
  bitmask<slang::ast::VariableFlags> *pbVar4;
  short sVar5;
  Compilation *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool bVar6;
  DeclaratorSyntax *decl;
  ClassPropertySymbol *this_01;
  ASTSerializer *serializer;
  long lVar7;
  RandMode RVar8;
  SourceRange sourceRange;
  string_view sVar9;
  VariableLifetime local_94;
  MemberSyntax *local_90;
  Visibility local_84;
  ClassPropertySymbol *var;
  char *local_78;
  Scope *local_70;
  iterator __begin2;
  SourceLocation local_38;
  
  this_00 = scope->compilation;
  local_90 = (syntax->declaration).ptr;
  serializer = (ASTSerializer *)0x0;
  local_94 = Automatic;
  local_84 = Public;
  RVar8 = None;
  bVar6 = false;
  do {
    local_70 = scope;
    if ((ASTSerializer *)
        ((syntax->qualifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
         _M_extent_value << 4) == serializer) {
      for (lVar7 = 0;
          (long)local_90[1].attributes.super_SyntaxListBase.super_SyntaxNode.previewNode << 4 !=
          lVar7; lVar7 = lVar7 + 0x10) {
        sVar5 = *(short *)((long)&(local_90[1].attributes.super_SyntaxListBase.super_SyntaxNode.
                                  parent)->kind + lVar7);
        if ((sVar5 != 0x67) && (sVar5 != 0x143)) {
          if (sVar5 == 0x11c) {
            local_94 = Static;
          }
          else {
            bVar6 = true;
          }
        }
      }
      psVar3 = &local_90[1].attributes.
                super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
      __begin2.index = 0;
      lVar7 = *(long *)&local_90[2].attributes.super_SyntaxListBase.super_SyntaxNode;
      __begin2.list = (ParentList *)psVar3;
      for (; (__begin2.list != (ParentList *)psVar3 || (__begin2.index != lVar7 + 1U >> 1));
          __begin2.index = __begin2.index + 1) {
        decl = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
               iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&__begin2);
        this = &decl->name;
        _var = parsing::Token::valueText(this);
        local_38 = parsing::Token::location(this);
        this_01 = BumpAllocator::
                  emplace<slang::ast::ClassPropertySymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::Visibility&>
                            (&this_00->super_BumpAllocator,
                             (basic_string_view<char,_std::char_traits<char>_> *)&var,&local_38,
                             &local_94,&local_84);
        var = this_01;
        this_01->randMode = RVar8;
        (this_01->super_VariableSymbol).super_ValueSymbol.declaredType.typeOrLink =
             (anon_union_8_2_f12d5f64_for_typeOrLink)
             local_90[1].attributes.super_SyntaxListBase.childCount;
        puVar1 = &(this_01->super_VariableSymbol).super_ValueSymbol.declaredType.field_0x3f;
        *puVar1 = *puVar1 & 0x7f;
        ValueSymbol::setFromDeclarator((ValueSymbol *)this_01,decl);
        syntax_00._M_ptr =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
        syntax_00._M_extent._M_extent_value =
             (syntax->super_MemberSyntax).attributes.
             super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
             _M_extent_value;
        Symbol::setAttributes((Symbol *)var,local_70,syntax_00);
        SmallVectorBase<slang::ast::ClassPropertySymbol_const*>::
        emplace_back<slang::ast::ClassPropertySymbol_const*const&>
                  ((SmallVectorBase<slang::ast::ClassPropertySymbol_const*> *)results,&var);
        if (bVar6) {
          pbVar4 = &(var->super_VariableSymbol).flags;
          pbVar4->m_bits = pbVar4->m_bits | 1;
        }
        if (RVar8 != None) {
          pbVar2 = &(var->super_VariableSymbol).super_ValueSymbol.declaredType.flags;
          pbVar2->m_bits = pbVar2->m_bits | 0x200;
        }
        if (((bool)(local_94 == Static & bVar6)) &&
           (decl->initializer == (EqualsValueClauseSyntax *)0x0)) {
          sourceRange = parsing::Token::range(this);
          Scope::addDiag(local_70,(DiagCode)0xc20006,sourceRange);
        }
      }
      return;
    }
    sVar5 = *(short *)((long)&serializer->compilation +
                      (long)(syntax->qualifiers).
                            super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr);
    switch(sVar5) {
    case 0xf1:
      local_84 = Protected;
      break;
    case 0xf2:
    case 0xf3:
    case 0xf4:
    case 0xf5:
    case 0xf6:
    case 0xf7:
      VariableSymbol::serializeTo((VariableSymbol *)0x2,serializer);
      sVar9 = ast::toString(VRam000000000000015a);
      ASTSerializer::write(serializer,10,"visibility",sVar9._M_len);
      if (RRam000000000000015e == None) {
        return;
      }
      sVar9 = ast::toString(RRam000000000000015e);
      ASTSerializer::write(serializer,8,"randMode",sVar9._M_len);
      return;
    case 0xf8:
      break;
    case 0xf9:
      RVar8 = Rand;
      break;
    case 0xfa:
      RVar8 = RandC;
      break;
    default:
      if ((sVar5 != 0x145) && (sVar5 != 0xa7)) {
        if (sVar5 == 0xd1) {
          local_84 = Local;
        }
        else if (sVar5 == 0x11c) {
          local_94 = Static;
        }
        else {
          bVar6 = true;
        }
      }
    }
    serializer = (ASTSerializer *)&serializer->includeAddrs;
  } while( true );
}

Assistant:

void ClassPropertySymbol::fromSyntax(const Scope& scope,
                                     const ClassPropertyDeclarationSyntax& syntax,
                                     SmallVectorBase<const ClassPropertySymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto& dataSyntax = syntax.declaration->as<DataDeclarationSyntax>();

    bool isConst = false;
    VariableLifetime lifetime = VariableLifetime::Automatic;
    Visibility visibility = Visibility::Public;
    RandMode randMode = RandMode::None;

    for (Token qual : syntax.qualifiers) {
        switch (qual.kind) {
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::LocalKeyword:
                visibility = Visibility::Local;
                break;
            case TokenKind::ProtectedKeyword:
                visibility = Visibility::Protected;
                break;
            case TokenKind::RandKeyword:
                randMode = RandMode::Rand;
                break;
            case TokenKind::RandCKeyword:
                randMode = RandMode::RandC;
                break;
            case TokenKind::PureKeyword:
            case TokenKind::VirtualKeyword:
            case TokenKind::ExternKeyword:
                // These are not allowed on properties; the parser will issue a diagnostic
                // so just ignore them here.
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (Token mod : dataSyntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
            case TokenKind::AutomaticKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                lifetime = VariableLifetime::Static;
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    for (auto declarator : dataSyntax.declarators) {
        auto var = comp.emplace<ClassPropertySymbol>(declarator->name.valueText(),
                                                     declarator->name.location(), lifetime,
                                                     visibility);
        var->randMode = randMode;
        var->setDeclaredType(*dataSyntax.type);
        var->setFromDeclarator(*declarator);
        var->setAttributes(scope, syntax.attributes);
        results.push_back(var);

        if (isConst)
            var->flags |= VariableFlags::Const;

        if (randMode != RandMode::None)
            var->getDeclaredType()->addFlags(DeclaredTypeFlags::Rand);

        if (isConst && lifetime == VariableLifetime::Static && !declarator->initializer)
            scope.addDiag(diag::StaticConstNoInitializer, declarator->name.range());
    }
}